

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetDomainNameByXpan
          (Registry *this,uint64_t aXpan,string *aName)

{
  int iVar1;
  undefined1 local_b0 [8];
  Domain dom;
  Network nwk;
  Status status;
  string *aName_local;
  uint64_t aXpan_local;
  Registry *this_local;
  
  Network::Network((Network *)((long)&dom.mName.field_2 + 8));
  Domain::Domain((Domain *)local_b0);
  nwk._95_1_ = GetNetworkByXpan(this,aXpan,(Network *)((long)&dom.mName.field_2 + 8));
  if (nwk._95_1_ == kSuccess) {
    iVar1 = (*this->mStorage->_vptr_PersistentStorage[0xd])
                      (this->mStorage,(undefined1 *)((long)&dom.mName.field_2 + 0xc),local_b0);
    nwk._95_1_ = anon_unknown_0::MapStatus((Status)iVar1);
    if (nwk._95_1_ == kSuccess) {
      std::__cxx11::string::operator=((string *)aName,(string *)&dom);
    }
  }
  Domain::~Domain((Domain *)local_b0);
  Network::~Network((Network *)((long)&dom.mName.field_2 + 8));
  return nwk._95_1_;
}

Assistant:

Registry::Status Registry::GetDomainNameByXpan(uint64_t aXpan, std::string &aName)
{
    Registry::Status status;
    Network          nwk;
    Domain           dom;

    VerifyOrExit(Registry::Status::kSuccess == (status = GetNetworkByXpan(aXpan, nwk)));
    VerifyOrExit(Registry::Status::kSuccess == (status = MapStatus(mStorage->Get(nwk.mDomainId, dom))));
    aName = dom.mName;
exit:
    return status;
}